

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnishingElementType::~IfcFurnishingElementType
          (IfcFurnishingElementType *this)

{
  ~IfcFurnishingElementType(this);
  operator_delete(this);
  return;
}

Assistant:

IfcFurnishingElementType() : Object("IfcFurnishingElementType") {}